

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRSDA::IntLoadResidual_F(ChLinkRSDA *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChBodyFrame *pCVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  double *pdVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Index index;
  ulong uVar17;
  ulong uVar18;
  undefined4 in_register_00000034;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double local_48 [4];
  double local_28;
  double local_20;
  double local_18;
  
  local_18 = c;
  iVar14 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                     (this,CONCAT44(in_register_00000034,off));
  if ((char)iVar14 != '\0') {
    local_28 = this->m_torque;
    local_20 = local_28 * (this->m_axis).m_data[0];
    local_48[3] = local_28 * (this->m_axis).m_data[1];
    local_28 = local_28 * (this->m_axis).m_data[2];
    iVar14 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var,iVar14) + 0x2c) == '\0') {
      pCVar13 = (this->super_ChLink).Body1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_20;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar1 = vfmadd231sd_fma(auVar19,auVar25,auVar1);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_28;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar1 = vfmadd231sd_fma(auVar1,auVar27,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar21,auVar25,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar23,auVar25,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar27,auVar6);
      local_48[0] = auVar1._0_8_;
      local_48[1] = auVar2._0_8_;
      local_48[2] = auVar3._0_8_;
      iVar14 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      iVar14 = *(int *)(CONCAT44(extraout_var_00,iVar14) + 0x30);
      if ((iVar14 < -3) ||
         (lVar15 = (long)(iVar14 + 3),
         (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
         lVar15)) goto LAB_005a683d;
      pdVar16 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar15;
      uVar17 = 3;
      if ((((ulong)pdVar16 & 7) == 0) &&
         (uVar18 = (ulong)(-((uint)((ulong)pdVar16 >> 3) & 0x1fffffff) & 7), uVar18 < 3)) {
        uVar17 = uVar18;
      }
      if (uVar17 != 0) {
        uVar18 = 0;
        do {
          pdVar16[uVar18] = pdVar16[uVar18] - local_18 * local_48[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      if (uVar17 < 3) {
        do {
          pdVar16[uVar17] = pdVar16[uVar17] - local_18 * local_48[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar17 != 3);
      }
    }
    iVar14 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_01,iVar14) + 0x2c) == '\0') {
      pCVar13 = (this->super_ChLink).Body2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_20;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar1 = vfmadd231sd_fma(auVar20,auVar26,auVar7);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_28;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar1 = vfmadd231sd_fma(auVar1,auVar28,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar22,auVar26,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar28,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           local_48[3] *
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar24,auVar26,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar28,auVar12);
      local_48[0] = auVar1._0_8_;
      local_48[1] = auVar2._0_8_;
      local_48[2] = auVar3._0_8_;
      iVar14 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      iVar14 = *(int *)(CONCAT44(extraout_var_02,iVar14) + 0x30);
      if ((iVar14 < -3) ||
         (lVar15 = (long)(iVar14 + 3),
         (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
         lVar15)) {
LAB_005a683d:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar16 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar15;
      uVar17 = 3;
      if ((((ulong)pdVar16 & 7) == 0) &&
         (uVar18 = (ulong)(-((uint)((ulong)pdVar16 >> 3) & 0x1fffffff) & 7), uVar18 < 3)) {
        uVar17 = uVar18;
      }
      if (uVar17 != 0) {
        uVar18 = 0;
        do {
          pdVar16[uVar18] = local_18 * local_48[uVar18] + pdVar16[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      if (uVar17 < 3) {
        do {
          pdVar16[uVar17] = local_18 * local_48[uVar17] + pdVar16[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar17 != 3);
      }
    }
  }
  return;
}

Assistant:

void ChLinkRSDA::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!IsActive())
        return;

    // Applied torque in absolute frame
    ChVector<> torque = m_torque * m_axis;

    // Load torques in 'R' vector accumulator (torques in local coords)
    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 3, 3) -= c * Body1->TransformDirectionParentToLocal(torque).eigen();
    }
    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 3, 3) += c * Body2->TransformDirectionParentToLocal(torque).eigen();
    }
}